

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbox_base.cpp
# Opt level: O0

void __thiscall cppurses::detail::Textbox_base::increment_cursor_right(Textbox_base *this)

{
  size_t sVar1;
  vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_> *this_00;
  size_type sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t cursor_index;
  size_t true_last_index;
  Textbox_base *this_local;
  
  sVar1 = Textbox_base::cursor_index(this);
  this_00 = &Text_display::contents(&this->super_Text_display)->
             super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>;
  sVar2 = std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::size(this_00);
  if (sVar1 != sVar2) {
    sVar1 = Text_display::bottom_line(&this->super_Text_display);
    sVar1 = Text_display::first_index_at(&this->super_Text_display,sVar1 + 1);
    sVar3 = Textbox_base::cursor_index(this);
    if (sVar3 == sVar1 - 1) {
      sVar1 = Cursor_data::y(&(this->super_Text_display).super_Widget.cursor);
      sVar4 = Widget::height((Widget *)this);
      if (sVar1 == sVar4 - 1) {
        (*(this->super_Text_display).super_Widget._vptr_Widget[0x2b])(this,1);
      }
    }
    set_cursor(this,sVar3 + 1);
  }
  return;
}

Assistant:

void Textbox_base::increment_cursor_right() {
    if (this->cursor_index() == this->contents().size()) {
        return;
    }
    auto true_last_index = this->first_index_at(this->bottom_line() + 1) - 1;
    auto cursor_index = this->cursor_index();
    if (cursor_index == true_last_index &&
        this->cursor.y() == this->height() - 1) {
        this->scroll_down(1);
    }
    this->set_cursor(cursor_index + 1);
}